

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

slist * gen_load_radiotap_llprefixlen(compiler_state_t *cstate)

{
  slist *psVar1;
  slist *s2;
  slist *s1;
  compiler_state_t *cstate_local;
  
  if ((cstate->off_linkhdr).reg == -1) {
    cstate_local = (compiler_state_t *)0x0;
  }
  else {
    cstate_local = (compiler_state_t *)new_stmt(cstate,0x30);
    *(bpf_int32 *)(cstate_local->top_ctx[0].__jmpbuf + 3) = 3;
    psVar1 = new_stmt(cstate,100);
    sappend((slist *)cstate_local,psVar1);
    (psVar1->s).k = 8;
    psVar1 = new_stmt(cstate,7);
    sappend((slist *)cstate_local,psVar1);
    psVar1 = new_stmt(cstate,0x30);
    sappend((slist *)cstate_local,psVar1);
    (psVar1->s).k = 2;
    psVar1 = new_stmt(cstate,0x4c);
    sappend((slist *)cstate_local,psVar1);
    psVar1 = new_stmt(cstate,2);
    (psVar1->s).k = (cstate->off_linkhdr).reg;
    sappend((slist *)cstate_local,psVar1);
    psVar1 = new_stmt(cstate,7);
    sappend((slist *)cstate_local,psVar1);
  }
  return (slist *)cstate_local;
}

Assistant:

static struct slist *
gen_load_radiotap_llprefixlen(compiler_state_t *cstate)
{
	struct slist *s1, *s2;

	/*
	 * Generate code to load the length of the radiotap header into
	 * the register assigned to hold that length, if one has been
	 * assigned.  (If one hasn't been assigned, no code we've
	 * generated uses that prefix, so we don't need to generate any
	 * code to load it.)
	 */
	if (cstate->off_linkhdr.reg != -1) {
		/*
		 * The 2 bytes at offsets of 2 and 3 from the beginning
		 * of the radiotap header are the length of the radiotap
		 * header; unfortunately, it's little-endian, so we have
		 * to load it a byte at a time and construct the value.
		 */

		/*
		 * Load the high-order byte, at an offset of 3, shift it
		 * left a byte, and put the result in the X register.
		 */
		s1 = new_stmt(cstate, BPF_LD|BPF_B|BPF_ABS);
		s1->s.k = 3;
		s2 = new_stmt(cstate, BPF_ALU|BPF_LSH|BPF_K);
		sappend(s1, s2);
		s2->s.k = 8;
		s2 = new_stmt(cstate, BPF_MISC|BPF_TAX);
		sappend(s1, s2);

		/*
		 * Load the next byte, at an offset of 2, and OR the
		 * value from the X register into it.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_B|BPF_ABS);
		sappend(s1, s2);
		s2->s.k = 2;
		s2 = new_stmt(cstate, BPF_ALU|BPF_OR|BPF_X);
		sappend(s1, s2);

		/*
		 * Now allocate a register to hold that value and store
		 * it.
		 */
		s2 = new_stmt(cstate, BPF_ST);
		s2->s.k = cstate->off_linkhdr.reg;
		sappend(s1, s2);

		/*
		 * Now move it into the X register.
		 */
		s2 = new_stmt(cstate, BPF_MISC|BPF_TAX);
		sappend(s1, s2);

		return (s1);
	} else
		return (NULL);
}